

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

int ply_read_word(p_ply ply)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *fmt;
  size_t sVar5;
  
  do {
    sVar5 = ply->buffer_first;
    sVar2 = strspn(ply->buffer + sVar5," \n\r\t");
    sVar4 = ply->buffer_last;
    if (sVar2 < sVar4 - sVar5) {
      sVar5 = sVar2 + sVar5;
      ply->buffer_first = sVar5;
      sVar2 = strcspn(ply->buffer + sVar5," \n\r\t");
      if (sVar4 - sVar5 <= sVar2) {
        iVar1 = BREFILL(ply);
        sVar5 = ply->buffer_first;
        if (iVar1 != 0) {
          sVar3 = strcspn(ply->buffer + sVar2 + sVar5," \n\r\t");
          if (sVar3 + sVar2 < ply->buffer_last - sVar5) {
            sVar4 = sVar3 + sVar2 + sVar5;
            ply->buffer_token = sVar5;
            ply->buffer_first = sVar4;
            ply->buffer[sVar4] = '\0';
            goto LAB_0032e340;
          }
          fmt = "Token too large";
          goto LAB_0032e297;
        }
      }
      ply->buffer_token = sVar5;
      ply->buffer_first = sVar2 + sVar5;
      ply->buffer[sVar2 + sVar5] = '\0';
LAB_0032e340:
      ply->buffer_first = ply->buffer_first + 1;
      iVar1 = ply_check_word(ply);
      return iVar1;
    }
    iVar1 = BREFILL(ply);
  } while (iVar1 != 0);
  fmt = "Unexpected end of file";
LAB_0032e297:
  ply_ferror(ply,fmt);
  return 0;
}

Assistant:

static int ply_read_word(p_ply ply) {
    size_t t = 0;
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    /* skip leading blanks */
    while (1) {
        t = strspn(BFIRST(ply), " \n\r\t");
        /* check if all buffer was made of blanks */
        if (t >= BSIZE(ply)) {
            if (!BREFILL(ply)) {
                ply_ferror(ply, "Unexpected end of file");
                return 0;
            }
        } else
            break;
    }
    BSKIP(ply, t);
    /* look for a space after the current word */
    t = strcspn(BFIRST(ply), " \n\r\t");
    /* if we didn't reach the end of the buffer, we are done */
    if (t < BSIZE(ply)) {
        ply_finish_word(ply, t);
        return ply_check_word(ply);
    }
    /* otherwise, try to refill buffer */
    if (!BREFILL(ply)) {
        /* if we reached the end of file, try to do with what we have */
        ply_finish_word(ply, t);
        return ply_check_word(ply);
        /* ply_ferror(ply, "Unexpected end of file"); */
        /* return 0; */
    }
    /* keep looking from where we left */
    t += strcspn(BFIRST(ply) + t, " \n\r\t");
    /* check if the token is too large for our buffer */
    if (t >= BSIZE(ply)) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply_finish_word(ply, t);
    return ply_check_word(ply);
}